

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O1

int tool_progress_cb(void *clientp,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,
                    curl_off_t ulnow)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [12];
  uint uVar4;
  uint uVar5;
  timediff_t tVar6;
  ulong uVar7;
  undefined4 uVar8;
  long lVar9;
  size_t __n;
  int iVar10;
  int iVar11;
  double dVar12;
  curltime cVar13;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  char format [40];
  char line [401];
  long local_210;
  undefined1 local_1f8 [48];
  char local_1c8;
  undefined4 local_1c7;
  undefined1 auStack_1c3 [403];
  
  cVar13 = curlx_now();
  lVar1 = *(long *)((long)clientp + 0xb8);
  if (lVar1 < 0) {
    local_210 = dltotal + ultotal;
    if (ultotal == 0 && dltotal == 0) {
      local_210 = 0x7fffffffffffffff;
    }
  }
  else {
    local_210 = lVar1 + dltotal + ultotal;
    if (0x7fffffffffffffff - lVar1 < dltotal + ultotal) {
      local_210 = 0x7fffffffffffffff;
    }
  }
  if (lVar1 < 0) {
    lVar9 = ulnow + dlnow;
    if (ultotal == 0 && dltotal == 0) {
      lVar9 = 0x7fffffffffffffff;
    }
  }
  else {
    lVar9 = lVar1 + ulnow + dlnow;
    if (0x7fffffffffffffff - lVar1 < ulnow + dlnow) {
      lVar9 = 0x7fffffffffffffff;
    }
  }
  lVar1 = *(long *)((long)clientp + 0x10);
  if (*(int *)((long)clientp + 0x88) != 0) {
    auVar3 = cVar13._0_12_;
    if (local_210 == 0) {
      newer_00._12_4_ = 0;
      newer_00.tv_sec = auVar3._0_8_;
      newer_00.tv_usec = auVar3._8_4_;
      older_00._12_4_ = 0;
      older_00._0_12_ = *(undefined1 (*) [12])((long)clientp + 0x98);
      tVar6 = curlx_timediff(newer_00,older_00);
      if (tVar6 < 100) {
        return 0;
      }
      uVar5 = get_terminal_columns();
      if ((int)uVar5 < 0x191) {
        if ((int)uVar5 < 0x15) {
          *(undefined4 *)((long)clientp + 0xa8) = 0x14;
        }
        else {
          *(uint *)((long)clientp + 0xa8) = uVar5;
        }
      }
      else {
        *(undefined4 *)((long)clientp + 0xa8) = 400;
      }
      lVar2 = *(long *)((long)clientp + 0x90);
      iVar11 = *(int *)((long)clientp + 0xa8);
      local_1c8 = '\r';
      memset(&local_1c7,0x20,(long)iVar11);
      (&local_1c8)[(long)iVar11 + 1] = '\0';
      iVar10 = *(int *)((long)clientp + 0xc4);
      *(undefined4 *)(auStack_1c3 + (long)iVar10 + 0xfffffffffffffffc) = 0x3d4f3d2d;
      auStack_1c3[iVar10] = 0x2d;
      uVar5 = *(uint *)((long)clientp + 0xc0);
      iVar10 = 0;
      iVar11 = (int)(1000000 / (long)(iVar11 + -2));
      (&local_1c8)[(long)(sinus[uVar5 % 200] / iVar11) + 1] = '#';
      (&local_1c8)[(long)(sinus[uVar5 + ((uVar5 + 5) / 200) * -200 + 5] / iVar11) + 1] = '#';
      (&local_1c8)[(long)(sinus[uVar5 + ((uVar5 + 10) / 200) * -200 + 10] / iVar11) + 1] = '#';
      (&local_1c8)[(long)(sinus[uVar5 + ((uVar5 + 0xf) / 200) * -200 + 0xf] / iVar11) + 1] = '#';
      fputs(&local_1c8,*(FILE **)((long)clientp + 0xb0));
      uVar5 = *(int *)((long)clientp + 0xc0) + 2;
      uVar4 = *(int *)((long)clientp + 0xc0) - 0xc6;
      if (uVar5 < 200) {
        uVar4 = uVar5;
      }
      *(uint *)((long)clientp + 0xc0) = uVar4;
      if (lVar9 != lVar2) {
        iVar10 = *(int *)((long)clientp + 200);
      }
      iVar10 = iVar10 + *(int *)((long)clientp + 0xc4);
      *(int *)((long)clientp + 0xc4) = iVar10;
      iVar11 = *(int *)((long)clientp + 0xa8) + -6;
      uVar8 = 0xffffffff;
      if (iVar10 < iVar11) {
        if (-1 < iVar10) goto LAB_0010bf68;
        iVar11 = 0;
        uVar8 = 1;
      }
      *(undefined4 *)((long)clientp + 200) = uVar8;
      *(int *)((long)clientp + 0xc4) = iVar11;
    }
    else {
      if (*(long *)((long)clientp + 0x90) == lVar9) {
        return 0;
      }
      newer._12_4_ = 0;
      newer.tv_sec = auVar3._0_8_;
      newer.tv_usec = auVar3._8_4_;
      older._12_4_ = 0;
      older._0_12_ = *(undefined1 (*) [12])((long)clientp + 0x98);
      tVar6 = curlx_timediff(newer,older);
      if ((tVar6 < 100) && (lVar9 < local_210)) {
        return 0;
      }
    }
  }
LAB_0010bf68:
  *(int *)((long)clientp + 0x88) = *(int *)((long)clientp + 0x88) + 1;
  uVar5 = get_terminal_columns();
  if ((int)uVar5 < 0x191) {
    if ((int)uVar5 < 0x15) {
      *(undefined4 *)((long)clientp + 0xa8) = 0x14;
    }
    else {
      *(uint *)((long)clientp + 0xa8) = uVar5;
    }
  }
  else {
    *(undefined4 *)((long)clientp + 0xa8) = 400;
  }
  if ((0 < local_210) && (lVar9 != *(long *)((long)clientp + 0x90))) {
    if (local_210 < lVar9) {
      local_210 = lVar9;
    }
    iVar11 = *(int *)((long)clientp + 0xa8) + -7;
    dVar12 = (double)iVar11 * ((double)lVar9 / (double)local_210);
    uVar7 = (ulong)dVar12;
    __n = (long)(dVar12 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7;
    if (399 < __n) {
      __n = 400;
    }
    memset(&local_1c8,0x23,__n);
    (&local_1c8)[__n] = '\0';
    curl_msnprintf(local_1f8,0x28,"\r%%-%ds %%5.1f%%%%",iVar11);
    curl_mfprintf(((double)lVar9 / (double)local_210) * 100.0,*(undefined8 *)((long)clientp + 0xb0),
                  local_1f8,&local_1c8);
  }
  fflush(*(FILE **)((long)clientp + 0xb0));
  *(long *)((long)clientp + 0x90) = lVar9;
  *(time_t *)((long)clientp + 0x98) = cVar13.tv_sec;
  *(int *)((long)clientp + 0xa0) = cVar13.tv_usec;
  uVar7 = *(ulong *)(lVar1 + 0x4e4);
  if (((uint)uVar7 >> 0x1d & 1) != 0) {
    *(ulong *)(lVar1 + 0x4e4) = uVar7 & 0xffffffffdfffffff;
    curl_easy_pause(*(undefined8 *)((long)clientp + 0x20),0);
  }
  return 0;
}

Assistant:

int tool_progress_cb(void *clientp,
                     curl_off_t dltotal, curl_off_t dlnow,
                     curl_off_t ultotal, curl_off_t ulnow)
{
  struct curltime now = curlx_now();
  struct per_transfer *per = clientp;
  struct OperationConfig *config = per->config;
  struct ProgressData *bar = &per->progressbar;
  curl_off_t total;
  curl_off_t point;

  /* Calculate expected transfer size. initial_size can be less than zero when
     indicating that we are expecting to get the filesize from the remote */
  if(bar->initial_size < 0) {
    if(dltotal || ultotal)
      total = dltotal + ultotal;
    else
      total = CURL_OFF_T_MAX;
  }
  else if((CURL_OFF_T_MAX - bar->initial_size) < (dltotal + ultotal))
    total = CURL_OFF_T_MAX;
  else
    total = dltotal + ultotal + bar->initial_size;

  /* Calculate the current progress. initial_size can be less than zero when
     indicating that we are expecting to get the filesize from the remote */
  if(bar->initial_size < 0) {
    if(dltotal || ultotal)
      point = dlnow + ulnow;
    else
      point = CURL_OFF_T_MAX;
  }
  else if((CURL_OFF_T_MAX - bar->initial_size) < (dlnow + ulnow))
    point = CURL_OFF_T_MAX;
  else
    point = dlnow + ulnow + bar->initial_size;

  if(bar->calls) {
    /* after first call... */
    if(total) {
      /* we know the total data to get... */
      if(bar->prev == point)
        /* progress did not change since last invoke */
        return 0;
      else if((curlx_timediff(now, bar->prevtime) < 100L) && point < total)
        /* limit progress-bar updating to 10 Hz except when we are at 100% */
        return 0;
    }
    else {
      /* total is unknown */
      if(curlx_timediff(now, bar->prevtime) < 100L)
        /* limit progress-bar updating to 10 Hz */
        return 0;
      update_width(bar);
      fly(bar, point != bar->prev);
    }
  }

  /* simply count invokes */
  bar->calls++;

  update_width(bar);
  if((total > 0) && (point != bar->prev)) {
    char line[MAX_BARLENGTH + 1];
    char format[40];
    double frac;
    double percent;
    int barwidth;
    size_t num;
    if(point > total)
      /* we have got more than the expected total! */
      total = point;

    frac = (double)point / (double)total;
    percent = frac * 100.0;
    barwidth = bar->width - 7;
    num = (size_t) (((double)barwidth) * frac);
    if(num > MAX_BARLENGTH)
      num = MAX_BARLENGTH;
    memset(line, '#', num);
    line[num] = '\0';
    msnprintf(format, sizeof(format), "\r%%-%ds %%5.1f%%%%", barwidth);
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#endif
    fprintf(bar->out, format, line, percent);
#ifdef __clang__
#pragma clang diagnostic pop
#endif
  }
  fflush(bar->out);
  bar->prev = point;
  bar->prevtime = now;

  if(config->readbusy) {
    config->readbusy = FALSE;
    curl_easy_pause(per->curl, CURLPAUSE_CONT);
  }

  return 0;
}